

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O3

string * JoinStringPiece_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<StringPiece,_std::allocator<StringPiece>_> *list,char sep)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  
  pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pSVar2 == pSVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar3 = (long)pSVar1 - (long)pSVar2 >> 4;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
        super__Vector_impl_data._M_finish != pSVar2) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        if (uVar4 != 0) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          pSVar2 = (pointer)((long)&((list->
                                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->str_ + lVar3);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pSVar2->str_);
        uVar4 = uVar4 + 1;
        pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < (ulong)((long)(list->
                                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4))
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string JoinStringPiece(const vector<StringPiece>& list, char sep) {
  if (list.empty()) {
    return "";
  }

  string ret;

  {
    size_t cap = list.size() - 1;
    for (size_t i = 0; i < list.size(); ++i) {
      cap += list[i].len_;
    }
    ret.reserve(cap);
  }

  for (size_t i = 0; i < list.size(); ++i) {
    if (i != 0) {
      ret += sep;
    }
    ret.append(list[i].str_, list[i].len_);
  }

  return ret;
}